

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_1::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  undefined8 in_RAX;
  undefined8 *puVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_00240c30;
    IMutableContext::currentContext[1] = (long)&PTR__Context_00240c80;
  }
  puVar1 = (undefined8 *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  poVar2 = (ostream *)(**(code **)(*(long *)*puVar1 + 0x18))();
  uStack_18 = CONCAT17(0x1b,(undefined7)uStack_18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_18 + 7),1);
  if (this == (PosixColourImpl *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)this,sVar3);
  }
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            getCurrentContext().getConfig()->stream()
                << '\033' << _escapeCode;
        }